

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex-match.c
# Opt level: O1

int regex_match(regex_t *r,char *to_match,basic_matchlist_t *match_list)

{
  basic_matchinfo_t **ppbVar1;
  int iVar2;
  char *pcVar3;
  basic_matchinfo_t *pbVar4;
  int unaff_R12D;
  int iVar5;
  int iVar6;
  char *__string;
  regmatch_t local_88 [11];
  
  __string = to_match;
  do {
    iVar2 = regexec((regex_t *)r,__string,10,local_88,0);
    iVar5 = iVar2;
    if (iVar2 == 0) {
      if (local_88[0].rm_so != -1) {
        iVar6 = (int)__string - (int)to_match;
        iVar5 = local_88[0].rm_so + iVar6;
        iVar6 = iVar6 + local_88[0].rm_eo;
        pcVar3 = strndup(to_match + iVar5,(long)(local_88[0].rm_eo - local_88[0].rm_so));
        pbVar4 = (basic_matchinfo_t *)malloc(0x20);
        pbVar4->start = iVar5;
        pbVar4->finish = iVar6;
        pbVar4->matched_text = pcVar3;
        (pbVar4->entries).tqe_next = (basic_matchinfo_t *)0x0;
        ppbVar1 = match_list->tqh_last;
        (pbVar4->entries).tqe_prev = ppbVar1;
        *ppbVar1 = pbVar4;
        match_list->tqh_last = &(pbVar4->entries).tqe_next;
      }
      __string = __string + local_88[0].rm_eo;
      iVar5 = unaff_R12D;
    }
    unaff_R12D = iVar5;
  } while (iVar2 == 0);
  return iVar5;
}

Assistant:

int regex_match (regex_t * r, const char * to_match, basic_matchlist_t *match_list)
{
    const char * p = to_match;
    const int n_matches = 10;
    regmatch_t m[n_matches];

    while (1)
    {
        int i = 0;
        int nomatch = regexec (r, p, n_matches, m, 0);
        if (nomatch)
        {
            //printf ("No more matches.\n");
            return nomatch;
        }
        //printf("nomatch = %d\n", nomatch);
        for (i = 0; i < n_matches; i++)
        {
            int start;
            int finish;
            if (m[i].rm_so == -1)
            {
                break;
            }

            start = m[i].rm_so + (p - to_match);
            finish = m[i].rm_eo + (p - to_match);
            char* matched_text = strndup(to_match+start, finish-start);
            //printf("Match %d at %d, %d\n", i, m[i].rm_so, m[i].rm_eo);
            basic_matchlist_add(match_list, start, finish, matched_text);
            break;
        }

        p += m[0].rm_eo;
    }
    return 0;
}